

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

int onig_is_in_code_range(OnigUChar *p,OnigCodePoint code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *(uint *)p;
  uVar3 = 0;
  uVar5 = 0;
  if (uVar1 != 0) {
    uVar5 = 0;
    uVar4 = uVar1;
    do {
      uVar2 = uVar4 + uVar5 >> 1;
      if (*(uint *)(p + (ulong)(uVar4 + uVar5 | 1) * 4 + 4) < code) {
        uVar5 = uVar2 + 1;
        uVar2 = uVar4;
      }
      uVar4 = uVar2;
    } while (uVar5 < uVar4);
  }
  if (uVar5 < uVar1) {
    uVar3 = (uint)(*(uint *)(p + (ulong)(uVar5 * 2) * 4 + 4) <= code);
  }
  return uVar3;
}

Assistant:

extern int
onig_is_in_code_range(const UChar* p, OnigCodePoint code)
{
  OnigCodePoint n, *data;
  OnigCodePoint low, high, x;

  GET_CODE_POINT(n, p);
  data = (OnigCodePoint* )p;
  data++;

  for (low = 0, high = n; low < high; ) {
    x = (low + high) >> 1;
    if (code > data[x * 2 + 1])
      low = x + 1;
    else
      high = x;
  }

  return ((low < n && code >= data[low * 2]) ? 1 : 0);
}